

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O2

Token * __thiscall Klex::getToken(Token *__return_storage_ptr__,Klex *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  string local_40;
  
  uVar1 = (this->lexeme)._M_string_length;
  uVar2 = this->colNum;
  uVar3 = 0;
  if (uVar1 <= uVar2) {
    uVar3 = uVar1;
  }
  std::__cxx11::string::string((string *)&local_40,(string *)&this->lexeme);
  Token::Token(__return_storage_ptr__,&local_40,this->tokenType,this->lineNum,uVar2 - uVar3);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Token Klex::getToken() {
    unsigned long col = colNum;
    if(lexeme.length() <= colNum)
        col = colNum - lexeme.length();
    return Token(lexeme, tokenType, lineNum, col);
}